

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::NonPackedFixed32::ByteSizeLong(NonPackedFixed32 *this)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  
  uVar2 = google::protobuf::RepeatedField<unsigned_int>::size
                    (&(this->field_0)._impl_.repeated_fixed32_);
  uVar3 = google::protobuf::RepeatedField<unsigned_int>::size
                    (&(this->field_0)._impl_.repeated_fixed32_);
  sVar4 = (ulong)uVar3 * 3 + (ulong)uVar2 * 4;
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    sVar4 = sVar4 + *(long *)((uVar1 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar4 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar4;
  }
  return sVar4;
}

Assistant:

::size_t NonPackedFixed32::ByteSizeLong() const {
  const NonPackedFixed32& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.NonPackedFixed32)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated fixed32 repeated_fixed32 = 2048;
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed32_size());
      ::size_t tag_size = ::size_t{3} *
          ::_pbi::FromIntSize(this_._internal_repeated_fixed32_size());
      total_size += tag_size + data_size;
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}